

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headlossmodel.cpp
# Opt level: O0

void __thiscall CM_HeadLossModel::setResistance(CM_HeadLossModel *this,Pipe *pipe)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double r;
  double d;
  Pipe *pipe_local;
  CM_HeadLossModel *this_local;
  
  dVar3 = (pipe->super_Link).diameter;
  dVar2 = (pipe->roughness * 4.0) / (dVar3 * 4.68097305446 * dVar3);
  dVar3 = pow(dVar3 / 4.0,-1.333);
  pipe->resistance = dVar2 * dVar2 * dVar3 * pipe->length;
  pdVar1 = std::min<double>(&pipe->resistance,(double *)&HIGH_RESISTANCE);
  pipe->resistance = *pdVar1;
  return;
}

Assistant:

void CM_HeadLossModel::setResistance(Pipe* pipe)
{
    double d = pipe->diameter;
    double r = 4.0 * pipe->roughness / (1.49 * PI * d * d);
    pipe->resistance = r * r * pow(d/4.0, -1.333) * pipe->length;
    pipe->resistance = min(pipe->resistance, HIGH_RESISTANCE);
}